

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

bStream * bsopen(bNread readPtr,void *parm)

{
  bStream *pbVar1;
  bstring ptVar2;
  
  if ((readPtr != (bNread)0x0) && (pbVar1 = (bStream *)malloc(0x20), pbVar1 != (bStream *)0x0)) {
    pbVar1->parm = parm;
    ptVar2 = bfromcstr(anon_var_dwarf_2abd1 + 0x10);
    pbVar1->buff = ptVar2;
    pbVar1->readFnPtr = readPtr;
    pbVar1->isEOF = 0;
    pbVar1->maxBuffSz = 0x400;
    return pbVar1;
  }
  return (bStream *)0x0;
}

Assistant:

struct bStream * bsopen (bNread readPtr, void * parm) {
struct bStream * s;

	if (readPtr == NULL) return NULL;
	s = (struct bStream *) bstr__alloc (sizeof (struct bStream));
	if (s == NULL) return NULL;
	s->parm = parm;
	s->buff = bfromcstr ("");
	s->readFnPtr = readPtr;
	s->maxBuffSz = BS_BUFF_SZ;
	s->isEOF = 0;
	return s;
}